

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O0

aiReturn __thiscall Assimp::BlobIOStream::Seek(BlobIOStream *this,size_t pOffset,aiOrigin pOrigin)

{
  unsigned_long *puVar1;
  aiOrigin pOrigin_local;
  size_t pOffset_local;
  BlobIOStream *this_local;
  
  if (pOrigin == aiOrigin_SET) {
    this->cursor = pOffset;
  }
  else if (pOrigin == aiOrigin_CUR) {
    this->cursor = pOffset + this->cursor;
  }
  else {
    if (pOrigin != aiOrigin_END) {
      return aiReturn_FAILURE;
    }
    this->cursor = this->file_size - pOffset;
  }
  if (this->file_size < this->cursor) {
    Grow(this,this->cursor);
  }
  puVar1 = std::max<unsigned_long>(&this->cursor,&this->file_size);
  this->file_size = *puVar1;
  return aiReturn_SUCCESS;
}

Assistant:

virtual aiReturn Seek(size_t pOffset,
        aiOrigin pOrigin)
    {
        switch(pOrigin)
        {
        case aiOrigin_CUR:
            cursor += pOffset;
            break;

        case aiOrigin_END:
            cursor = file_size - pOffset;
            break;

        case aiOrigin_SET:
            cursor = pOffset;
            break;

        default:
            return AI_FAILURE;
        }

        if (cursor > file_size) {
            Grow(cursor);
        }

        file_size = std::max(cursor,file_size);
        return AI_SUCCESS;
    }